

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::TransRangeSyntax::setChild(TransRangeSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  undefined4 uVar2;
  SyntaxNode *pSVar3;
  TransRepeatRangeSyntax *pTVar4;
  
  pSVar3 = TokenOrSyntax::node(&child);
  if (index == 0) {
    (this->items).super_SyntaxListBase.super_SyntaxNode.previewNode = pSVar3->previewNode;
    uVar2 = *(undefined4 *)&pSVar3->field_0x4;
    pSVar1 = pSVar3->parent;
    (this->items).super_SyntaxListBase.super_SyntaxNode.kind = pSVar3->kind;
    *(undefined4 *)&(this->items).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar2;
    (this->items).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
    (this->items).super_SyntaxListBase.childCount = *(size_t *)(pSVar3 + 1);
    pSVar1 = pSVar3[1].previewNode;
    (this->items).elements._M_ptr = (pointer)pSVar3[1].parent;
    (this->items).elements._M_extent._M_extent_value = (size_t)pSVar1;
  }
  else {
    if (pSVar3 == (SyntaxNode *)0x0) {
      pTVar4 = (TransRepeatRangeSyntax *)0x0;
    }
    else {
      pTVar4 = (TransRepeatRangeSyntax *)TokenOrSyntax::node(&child);
    }
    this->repeat = pTVar4;
  }
  return;
}

Assistant:

void TransRangeSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: items = child.node()->as<SeparatedSyntaxList<ExpressionSyntax>>(); return;
        case 1: repeat = child.node() ? &child.node()->as<TransRepeatRangeSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}